

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O3

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  JSAMPLE JVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  JSAMPLE *pJVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  uint auStack_154 [7];
  uint auStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar11 = 9;
  lVar13 = 0;
  do {
    sVar1 = *(short *)((long)coef_block + lVar13 + 0x10);
    sVar5 = *(short *)((long)coef_block + lVar13 + 0x20);
    if (sVar5 == 0 && sVar1 == 0) {
      if ((((*(short *)((long)coef_block + lVar13 + 0x30) != 0) ||
           (*(short *)((long)coef_block + lVar13 + 0x40) != 0)) ||
          (*(short *)((long)coef_block + lVar13 + 0x50) != 0)) ||
         ((*(short *)((long)coef_block + lVar13 + 0x60) != 0 ||
          (*(short *)((long)coef_block + lVar13 + 0x70) != 0)))) {
        sVar5 = 0;
        goto LAB_001196ad;
      }
      iVar14 = (int)*(short *)((long)coef_block + lVar13) * *(int *)((long)pvVar3 + lVar13 * 2);
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x1c) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x3c) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x5c) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x7c) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x9c) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0xbc) = iVar14;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0xdc) = iVar14;
      lVar8 = 0xe0;
    }
    else {
LAB_001196ad:
      iVar18 = (int)*(short *)((long)coef_block + lVar13) * *(int *)((long)pvVar3 + lVar13 * 2);
      iVar6 = (int)sVar5 * *(int *)((long)pvVar3 + lVar13 * 2 + 0x40);
      iVar20 = (int)*(short *)((long)coef_block + lVar13 + 0x40) *
               *(int *)((long)pvVar3 + lVar13 * 2 + 0x80);
      iVar15 = (int)*(short *)((long)coef_block + lVar13 + 0x60) *
               *(int *)((long)pvVar3 + lVar13 * 2 + 0xc0);
      iVar14 = iVar20 + iVar18;
      iVar18 = iVar18 - iVar20;
      iVar20 = iVar15 + iVar6;
      iVar6 = (int)((ulong)((long)(iVar6 - iVar15) * 0x16a) >> 8) - iVar20;
      iVar21 = iVar14 + iVar20;
      iVar9 = (int)sVar1 * *(int *)((long)pvVar3 + lVar13 * 2 + 0x20);
      iVar14 = iVar14 - iVar20;
      iVar17 = (int)*(short *)((long)coef_block + lVar13 + 0x30) *
               *(int *)((long)pvVar3 + lVar13 * 2 + 0x60);
      iVar20 = iVar6 + iVar18;
      iVar10 = (int)*(short *)((long)coef_block + lVar13 + 0x50) *
               *(int *)((long)pvVar3 + lVar13 * 2 + 0xa0);
      iVar18 = iVar18 - iVar6;
      iVar7 = (int)*(short *)((long)coef_block + lVar13 + 0x70) *
              *(int *)((long)pvVar3 + lVar13 * 2 + 0xe0);
      iVar15 = iVar10 + iVar17;
      iVar10 = iVar10 - iVar17;
      iVar6 = iVar7 + iVar9;
      iVar9 = iVar9 - iVar7;
      iVar7 = iVar15 + iVar6;
      iVar17 = (int)((ulong)((long)(iVar9 + iVar10) * 0x1d9) >> 8);
      iVar10 = ((int)((ulong)((long)iVar10 * 0xfffffffd63) >> 8) - iVar7) + iVar17;
      iVar15 = (int)((ulong)((long)(iVar6 - iVar15) * 0x16a) >> 8) - iVar10;
      iVar6 = ((int)((ulong)((long)iVar9 * 0x115) >> 8) - iVar17) + iVar15;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x1c) = iVar7 + iVar21;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0xfc) = iVar21 - iVar7;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x3c) = iVar20 + iVar10;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0xdc) = iVar20 - iVar10;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x5c) = iVar18 + iVar15;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0xbc) = iVar18 - iVar15;
      *(int *)((long)auStack_154 + lVar13 * 2 + 0x9c) = iVar6 + iVar14;
      iVar14 = iVar14 - iVar6;
      lVar8 = 0x60;
    }
    *(int *)((long)auStack_154 + lVar13 * 2 + lVar8 + 0x1c) = iVar14;
    uVar11 = uVar11 - 1;
    lVar13 = lVar13 + 2;
  } while (1 < uVar11);
  lVar13 = 7;
  do {
    pJVar12 = (JSAMPLE *)(*(long *)((long)output_buf + lVar13 + -7) + (ulong)output_col);
    uVar11 = auStack_154[lVar13 + 1];
    uVar16 = auStack_154[lVar13 + 2];
    if (auStack_154[lVar13 + 2] == 0 && uVar11 == 0) {
      uVar19 = 0;
      uVar16 = 0;
      if (((auStack_154[lVar13 + 3] != 0) || (auStack_154[lVar13 + 4] != 0)) ||
         ((uVar16 = uVar19, auStack_154[lVar13 + 5] != 0 ||
          ((auStack_154[lVar13 + 6] != 0 || (auStack_154[lVar13 + 7] != 0)))))) goto LAB_00119882;
      JVar4 = pJVar2[(ulong)(auStack_154[lVar13] >> 5 & 0x3ff) + 0x80];
      auVar22 = pshuflw(ZEXT216(CONCAT11(JVar4,JVar4)),ZEXT216(CONCAT11(JVar4,JVar4)),0);
      *(int *)pJVar12 = auVar22._0_4_;
      pJVar12[4] = JVar4;
      pJVar12[5] = JVar4;
      pJVar12[6] = JVar4;
      lVar8 = 7;
    }
    else {
LAB_00119882:
      iVar14 = auStack_154[lVar13 + 4] + auStack_154[lVar13];
      iVar10 = auStack_154[lVar13] - auStack_154[lVar13 + 4];
      iVar20 = auStack_154[lVar13 + 6] + uVar16;
      iVar6 = (int)((ulong)(uVar16 - auStack_154[lVar13 + 6]) * 0x16a >> 8) - iVar20;
      iVar18 = iVar20 + iVar14;
      iVar14 = iVar14 - iVar20;
      iVar20 = iVar6 + iVar10;
      iVar10 = iVar10 - iVar6;
      iVar6 = auStack_154[lVar13 + 3] + auStack_154[lVar13 + 5];
      uVar16 = auStack_154[lVar13 + 5] - auStack_154[lVar13 + 3];
      iVar15 = auStack_154[lVar13 + 7] + uVar11;
      uVar11 = uVar11 - auStack_154[lVar13 + 7];
      iVar9 = iVar15 + iVar6;
      iVar7 = (int)((ulong)(uVar11 + uVar16) * 0x1d9 >> 8);
      iVar17 = ((int)((ulong)uVar16 * 0xfffffffd63 >> 8) - iVar9) + iVar7;
      iVar15 = (int)((ulong)(uint)(iVar15 - iVar6) * 0x16a >> 8) - iVar17;
      iVar6 = ((int)((ulong)uVar11 * 0x115 >> 8) - iVar7) + iVar15;
      *pJVar12 = pJVar2[(ulong)((uint)(iVar9 + iVar18) >> 5 & 0x3ff) + 0x80];
      pJVar12[7] = pJVar2[(ulong)((uint)(iVar18 - iVar9) >> 5 & 0x3ff) + 0x80];
      pJVar12[1] = pJVar2[(ulong)((uint)(iVar17 + iVar20) >> 5 & 0x3ff) + 0x80];
      pJVar12[6] = pJVar2[(ulong)((uint)(iVar20 - iVar17) >> 5 & 0x3ff) + 0x80];
      pJVar12[2] = pJVar2[(ulong)((uint)(iVar15 + iVar10) >> 5 & 0x3ff) + 0x80];
      pJVar12[5] = pJVar2[(ulong)((uint)(iVar10 - iVar15) >> 5 & 0x3ff) + 0x80];
      pJVar12[4] = pJVar2[(ulong)((uint)(iVar6 + iVar14) >> 5 & 0x3ff) + 0x80];
      JVar4 = pJVar2[(ulong)((uint)(iVar14 - iVar6) >> 5 & 0x3ff) + 0x80];
      lVar8 = 3;
    }
    pJVar12[lVar8] = JVar4;
    lVar13 = lVar13 + 8;
    if (lVar13 == 0x47) {
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS			/* for DESCALE */
  ISHIFT_TEMPS			/* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = (int) DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = tmp0 + tmp2;	/* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;	/* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;	/* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;
    
    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    z13 = tmp6 + tmp5;		/* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE*0] = (int) (tmp0 + tmp7);
    wsptr[DCTSIZE*7] = (int) (tmp0 - tmp7);
    wsptr[DCTSIZE*1] = (int) (tmp1 + tmp6);
    wsptr[DCTSIZE*6] = (int) (tmp1 - tmp6);
    wsptr[DCTSIZE*2] = (int) (tmp2 + tmp5);
    wsptr[DCTSIZE*5] = (int) (tmp2 - tmp5);
    wsptr[DCTSIZE*4] = (int) (tmp3 + tmp4);
    wsptr[DCTSIZE*3] = (int) (tmp3 - tmp4);

    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }
  
  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */
    
#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[IDESCALE(wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];
      
      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif
    
    /* Even part */

    tmp10 = ((DCTELEM) wsptr[0] + (DCTELEM) wsptr[4]);
    tmp11 = ((DCTELEM) wsptr[0] - (DCTELEM) wsptr[4]);

    tmp13 = ((DCTELEM) wsptr[2] + (DCTELEM) wsptr[6]);
    tmp12 = MULTIPLY((DCTELEM) wsptr[2] - (DCTELEM) wsptr[6], FIX_1_414213562)
	    - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM) wsptr[5] + (DCTELEM) wsptr[3];
    z10 = (DCTELEM) wsptr[5] - (DCTELEM) wsptr[3];
    z11 = (DCTELEM) wsptr[1] + (DCTELEM) wsptr[7];
    z12 = (DCTELEM) wsptr[1] - (DCTELEM) wsptr[7];

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] = range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}